

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_TreeFindTreesTest(Gia_Man_t *p)

{
  void *__ptr;
  int *__ptr_00;
  Vec_Int_t *__ptr_01;
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Vec_Wec_t *pVVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  timespec ts;
  timespec local_50;
  Vec_Int_t *local_40;
  Vec_Wec_t *local_38;
  
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  pVVar3 = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar2 = Ree_ManCountFadds(pVVar3);
  printf("Detected %d adders (%d FAs and %d HAs).  ",(ulong)(uint)(pVVar3->nSize / 6),(ulong)uVar2);
  iVar7 = 3;
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  uVar9 = 0;
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  pVVar4 = Acec_TreeFindTrees(p,pVVar3,(Vec_Bit_t *)0x0,0,0);
  uVar2 = pVVar4->nSize;
  uVar8 = (ulong)(int)uVar2;
  if (0 < (long)uVar8) {
    lVar6 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + *(int *)((long)&pVVar4->pArray->nSize + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (uVar8 << 4 != lVar6);
    uVar9 = (ulong)(uint)(iVar1 / 2);
  }
  printf("Collected %d trees with %d adders in them.  ",(ulong)uVar2,uVar9);
  iVar7 = 3;
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  local_40 = pVVar3;
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
  pVVar3 = pVVar4->pArray;
  local_38 = pVVar4;
  if (0 < (int)uVar2) {
    uVar9 = 0;
    do {
      printf(" %4d : {",uVar9 & 0xffffffff);
      if (0 < pVVar3[uVar9].nSize) {
        lVar5 = 0;
        do {
          printf(" %d",(ulong)(uint)pVVar3[uVar9].pArray[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 < pVVar3[uVar9].nSize);
      }
      puts(" }");
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
  }
  __ptr_01 = local_40;
  iVar1 = local_38->nCap;
  if ((long)iVar1 < 1) {
    if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_00687f75;
  }
  else {
    lVar5 = 0;
    do {
      __ptr = *(void **)((long)&pVVar3->pArray + lVar5);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar3->pArray + lVar5) = 0;
      }
      lVar5 = lVar5 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar5);
  }
  free(pVVar3);
LAB_00687f75:
  free(local_38);
  __ptr_00 = __ptr_01->pArray;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  free(__ptr_01);
  return;
}

Assistant:

void Acec_TreeFindTreesTest( Gia_Man_t * p )
{
    Vec_Wec_t * vTrees;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d adders (%d FAs and %d HAs).  ", Vec_IntSize(vAdds)/6, nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vTrees = Acec_TreeFindTrees( p, vAdds, NULL, 0, 0 );
    printf( "Collected %d trees with %d adders in them.  ", Vec_WecSize(vTrees), Vec_WecSizeSize(vTrees)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_WecPrint( vTrees, 0 );

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
}